

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::MeshGeometry::MeshGeometry
          (MeshGeometry *this,uint64_t id,Element *element,string *name,Document *doc)

{
  MatIndexArray *__s;
  pointer *ppaVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  pointer *ppuVar2;
  uint uVar3;
  uint uVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  *this_03;
  iterator __position;
  iterator __position_00;
  pointer puVar5;
  float fVar6;
  Document *pDVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  Element *el;
  uint *puVar11;
  Scope *layer;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
  _Var12;
  aiVector3t<float> *__args;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  pVar16;
  uint count;
  vector<int,_std::allocator<int>_> tempFaces;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempVerts;
  char *err;
  uint local_e4;
  string local_e0;
  allocator local_b9;
  vector<int,_std::allocator<int>_> local_b8;
  Element *local_a0;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_98;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_80;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *local_78;
  Element *local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_60;
  _Rb_tree_node_base *local_58;
  MatIndexArray *local_50;
  Document *local_48;
  uint *local_40;
  char *local_38;
  
  local_a0 = element;
  local_48 = doc;
  Geometry::Geometry(&this->super_Geometry,id,element,name,doc);
  (this->super_Geometry).super_Object._vptr_Object = (_func_int **)&PTR__MeshGeometry_00937060;
  __s = &this->m_materials;
  local_78 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&this->m_vertices;
  local_80 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_faces;
  memset(__s,0,0xa8);
  lVar10 = 0x110;
  do {
    *(long *)((long)this + lVar10 + -0x10) =
         (long)&(this->super_Geometry).super_Object._vptr_Object + lVar10;
    *(undefined8 *)((long)this + lVar10 + -8) = 0;
    *(undefined1 *)((long)&(this->super_Geometry).super_Object._vptr_Object + lVar10) = 0;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0x210);
  this_00 = &this->m_mapping_counts;
  this_01 = &this->m_mapping_offsets;
  this_02 = &this->m_mappings;
  memset(this->m_uvs,0,0x1c8);
  this_03 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
             *)(local_a0->compound)._M_t.
               super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>.
               _M_t.
               super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>
               .super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_68 = this_02;
  local_60 = this_01;
  local_50 = __s;
  if (this_03 ==
      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
       *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,
               "failed to read Geometry object (class: Mesh), no data scope found","");
    Util::DOMError(&local_e0,(Element *)0x0);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Vertices","");
  el = GetRequiredElement((Scope *)this_03,&local_e0,local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"PolygonVertexIndex","");
  local_70 = GetRequiredElement((Scope *)this_03,&local_e0,local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Layer","");
  pVar16 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
           ::equal_range(this_03,&local_e0);
  local_58 = (_Rb_tree_node_base *)pVar16.second._M_node;
  _Var12 = pVar16.first._M_node;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  local_98.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseVectorDataArray(&local_98,el);
  if (local_98.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_98.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x5f01fe);
  }
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ParseVectorDataArray(&local_b8,local_70);
  if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x5f0239);
  }
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_78,
             (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
             (ulong)((long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2) / 3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (this_01,((long)local_98.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_98.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555);
  local_e0._M_dataplus._M_p = local_e0._M_dataplus._M_p & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (this_00,((long)local_98.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_98.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
             (value_type_conflict3 *)&local_e0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (this_02,(long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2);
  uVar13 = ((long)local_98.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_98.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  local_e4 = 0;
  local_40 = (uint *)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
  puVar11 = (uint *)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
  if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      uVar8 = *puVar11;
      uVar15 = (ulong)(int)((int)uVar8 >> 0x1f ^ uVar8);
      if (uVar13 < uVar15 || uVar13 - uVar15 == 0) {
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"polygon vertex index out of range","");
        Util::DOMError(&local_e0,local_70);
      }
      __args = local_98.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar15;
      __position._M_current =
           (this->m_vertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_vertices).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>(local_78,__position,__args);
      }
      else {
        (__position._M_current)->z = __args->z;
        fVar6 = __args->y;
        (__position._M_current)->x = __args->x;
        (__position._M_current)->y = fVar6;
        ppaVar1 = &(this->m_vertices).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      local_e4 = local_e4 + 1;
      puVar5 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start + uVar15;
      *puVar5 = *puVar5 + 1;
      if ((int)uVar8 < 0) {
        __position_00._M_current =
             (this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(local_80,__position_00,&local_e4);
        }
        else {
          *__position_00._M_current = local_e4;
          ppuVar2 = &(this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppuVar2 = *ppuVar2 + 1;
        }
        local_e4 = 0;
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 != local_40);
    uVar13 = ((long)local_98.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_98.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  }
  pDVar7 = local_48;
  if (local_98.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_98.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar8 = 0;
    lVar10 = 0;
    do {
      (local_60->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar10] = uVar8;
      puVar5 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = uVar8 + puVar5[lVar10];
      puVar5[lVar10] = 0;
      lVar10 = lVar10 + 1;
    } while (uVar13 + (uVar13 == 0) != lVar10);
  }
  if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar8 = 0;
    puVar11 = (uint *)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
    do {
      uVar14 = (int)*puVar11 >> 0x1f ^ *puVar11;
      puVar5 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = puVar5[(int)uVar14];
      uVar4 = (local_60->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[(int)uVar14];
      puVar5[(int)uVar14] = uVar3 + 1;
      (local_68->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar3 + uVar4] = uVar8;
      uVar8 = uVar8 + 1;
      puVar11 = puVar11 + 1;
    } while (puVar11 !=
             (uint *)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  }
  if (_Var12._M_node != local_58) {
    do {
      iVar9 = ParseTokenAsInt((Token *)**(undefined8 **)(*(long *)(_Var12._M_node + 2) + 8),
                              &local_38);
      if (local_38 != (char *)0x0) {
        std::__cxx11::string::string((string *)&local_e0,local_38,&local_b9);
        Util::DOMError(&local_e0,local_a0);
      }
      if ((iVar9 == 0) || (pDVar7->settings->readAllLayers != false)) {
        layer = GetRequiredScope(*(Element **)(_Var12._M_node + 2));
        ReadLayer(this,layer);
      }
      else {
        LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x5f04d6);
      }
      _Var12._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var12._M_node);
    } while (_Var12._M_node != local_58);
  }
  if ((uint *)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (uint *)0x0) {
    operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

MeshGeometry::MeshGeometry(uint64_t id, const Element& element, const std::string& name, const Document& doc)
: Geometry(id, element,name, doc)
{
    const Scope* sc = element.Compound();
    if (!sc) {
        DOMError("failed to read Geometry object (class: Mesh), no data scope found");
    }

    // must have Mesh elements:
    const Element& Vertices = GetRequiredElement(*sc,"Vertices",&element);
    const Element& PolygonVertexIndex = GetRequiredElement(*sc,"PolygonVertexIndex",&element);

    // optional Mesh elements:
    const ElementCollection& Layer = sc->GetCollection("Layer");

    std::vector<aiVector3D> tempVerts;
    ParseVectorDataArray(tempVerts,Vertices);

    if(tempVerts.empty()) {
        FBXImporter::LogWarn("encountered mesh with no vertices");
    }

    std::vector<int> tempFaces;
    ParseVectorDataArray(tempFaces,PolygonVertexIndex);

    if(tempFaces.empty()) {
        FBXImporter::LogWarn("encountered mesh with no faces");
    }

    m_vertices.reserve(tempFaces.size());
    m_faces.reserve(tempFaces.size() / 3);

    m_mapping_offsets.resize(tempVerts.size());
    m_mapping_counts.resize(tempVerts.size(),0);
    m_mappings.resize(tempFaces.size());

    const size_t vertex_count = tempVerts.size();

    // generate output vertices, computing an adjacency table to
    // preserve the mapping from fbx indices to *this* indexing.
    unsigned int count = 0;
    for(int index : tempFaces) {
        const int absi = index < 0 ? (-index - 1) : index;
        if(static_cast<size_t>(absi) >= vertex_count) {
            DOMError("polygon vertex index out of range",&PolygonVertexIndex);
        }

        m_vertices.push_back(tempVerts[absi]);
        ++count;

        ++m_mapping_counts[absi];

        if (index < 0) {
            m_faces.push_back(count);
            count = 0;
        }
    }

    unsigned int cursor = 0;
    for (size_t i = 0, e = tempVerts.size(); i < e; ++i) {
        m_mapping_offsets[i] = cursor;
        cursor += m_mapping_counts[i];

        m_mapping_counts[i] = 0;
    }

    cursor = 0;
    for(int index : tempFaces) {
        const int absi = index < 0 ? (-index - 1) : index;
        m_mappings[m_mapping_offsets[absi] + m_mapping_counts[absi]++] = cursor++;
    }

    // if settings.readAllLayers is true:
    //  * read all layers, try to load as many vertex channels as possible
    // if settings.readAllLayers is false:
    //  * read only the layer with index 0, but warn about any further layers
    for (ElementMap::const_iterator it = Layer.first; it != Layer.second; ++it) {
        const TokenList& tokens = (*it).second->Tokens();

        const char* err;
        const int index = ParseTokenAsInt(*tokens[0], err);
        if(err) {
            DOMError(err,&element);
        }

        if(doc.Settings().readAllLayers || index == 0) {
            const Scope& layer = GetRequiredScope(*(*it).second);
            ReadLayer(layer);
        }
        else {
            FBXImporter::LogWarn("ignoring additional geometry layers");
        }
    }
}